

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
tld::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
vector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *that)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *puVar4;
  string *psVar5;
  long in_RSI;
  undefined8 *in_RDI;
  ulong uVar6;
  size_t i;
  string *local_40;
  ulong local_18;
  
  *in_RDI = 0x10;
  uVar1 = *(ulong *)(in_RSI + 0x18);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar3 = SUB168(auVar2 * ZEXT816(0x20),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar2 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar1;
  psVar5 = (string *)(puVar4 + 1);
  if (uVar1 != 0) {
    local_40 = psVar5;
    do {
      std::__cxx11::string::string(local_40);
      local_40 = local_40 + 0x20;
    } while (local_40 != psVar5 + uVar1 * 0x20);
  }
  in_RDI[1] = psVar5;
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x10);
  in_RDI[3] = *(undefined8 *)(in_RSI + 0x18);
  for (local_18 = 0; local_18 < (ulong)in_RDI[2]; local_18 = local_18 + 1) {
    std::__cxx11::string::operator=
              ((string *)(in_RDI[1] + local_18 * 0x20),
               (string *)(*(long *)(in_RSI + 8) + local_18 * 0x20));
  }
  return;
}

Assistant:

vector<T>::vector(const vector<T>& that) :
    m_data_(new T[that.capacity_]),
    size_(that.size_),
    capacity_(that.capacity_)
{
    for (std::size_t i = 0; i < size_; i++)
        m_data_[i] = that.m_data_[i];
}